

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

liu * __thiscall liu::sigmoid(liu *this,Mat *x)

{
  Scalar_<double> local_500;
  Scalar_ local_4e0 [352];
  MatExpr local_380 [352];
  _OutputArray local_220;
  cv local_1f8 [352];
  _InputArray local_98;
  undefined1 local_79;
  Mat local_78 [8];
  Mat exp_x;
  Mat *x_local;
  Mat *fx;
  
  cv::Mat::Mat(local_78);
  local_79 = 0;
  cv::Mat::Mat((Mat *)this);
  cv::operator-(local_1f8,x);
  cv::_InputArray::_InputArray(&local_98,(MatExpr *)local_1f8);
  cv::_OutputArray::_OutputArray(&local_220,local_78);
  cv::exp(&local_98,&local_220);
  cv::_OutputArray::~_OutputArray(&local_220);
  cv::_InputArray::~_InputArray(&local_98);
  cv::MatExpr::~MatExpr((MatExpr *)local_1f8);
  cv::Scalar_<double>::Scalar_(&local_500,1.0);
  cv::operator+(local_4e0,(Mat *)&local_500);
  cv::operator/(1.0,local_380);
  cv::Mat::operator=((Mat *)this,local_380);
  cv::MatExpr::~MatExpr(local_380);
  cv::MatExpr::~MatExpr((MatExpr *)local_4e0);
  local_79 = 1;
  cv::Mat::~Mat(local_78);
  return this;
}

Assistant:

cv::Mat sigmoid(cv::Mat &x)
	{
		cv::Mat exp_x, fx;
		cv::exp(-x, exp_x);
		fx = 1.0 / (1.0 + exp_x);
		return fx;
	}